

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.cpp
# Opt level: O1

void Omega_h::find_matches_deg<3,long>
               (LOs *a2fv,Read<int> *av2v,Read<int> *bv2v,Adj *v2b,Write<int> *a2b_out,
               Write<signed_char> *codes_out,bool allow_duplicates)

{
  int *piVar1;
  LOs *pLVar2;
  Alloc *pAVar3;
  int size_in;
  undefined8 uVar4;
  Write<signed_char> *pWVar5;
  Write<int> *pWVar6;
  long *plVar7;
  ulong *puVar8;
  ulong uVar9;
  ScopedTimer omega_h_scoped_function_timer;
  LOs v2vb;
  LOs vb2b;
  Write<signed_char> codes;
  Write<int> a2b;
  type f;
  ScopedTimer local_151;
  Alloc *local_150;
  void *local_148;
  undefined1 local_140 [32];
  ulong local_120;
  long lStack_118;
  Alloc *local_110;
  void *local_108;
  undefined1 local_100 [24];
  undefined1 local_e8 [16];
  void *local_d8;
  type local_d0;
  Write<signed_char> *local_48;
  Write<int> *local_40;
  Read<int> *local_38;
  
  local_110 = (Alloc *)local_100;
  local_38 = bv2v;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_110,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_adj.cpp"
             ,"");
  local_40 = a2b_out;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_110);
  puVar8 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar8) {
    local_120 = *puVar8;
    lStack_118 = plVar7[3];
    local_140._16_8_ = &local_120;
  }
  else {
    local_120 = *puVar8;
    local_140._16_8_ = (ulong *)*plVar7;
  }
  local_140._24_8_ = plVar7[1];
  *plVar7 = (long)puVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_150 = (Alloc *)local_140;
  std::__cxx11::string::_M_construct((ulong)&local_150,'\x03');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_150,3,0x169);
  uVar9 = 0xf;
  if ((ulong *)local_140._16_8_ != &local_120) {
    uVar9 = local_120;
  }
  if (uVar9 < (ulong)((long)local_148 + local_140._24_8_)) {
    uVar9 = 0xf;
    if (local_150 != (Alloc *)local_140) {
      uVar9 = local_140._0_8_;
    }
    if ((ulong)((long)local_148 + local_140._24_8_) <= uVar9) {
      plVar7 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_150,0,(char *)0x0,local_140._16_8_);
      goto LAB_001da417;
    }
  }
  plVar7 = (long *)std::__cxx11::string::_M_append(local_140 + 0x10,(ulong)local_150);
LAB_001da417:
  local_d0.a2fv.write_.shared_alloc_.alloc = (Alloc *)&local_d0.v2vb;
  pAVar3 = (Alloc *)(plVar7 + 2);
  if ((Alloc *)*plVar7 == pAVar3) {
    local_d0.v2vb.write_.shared_alloc_.alloc = (Alloc *)pAVar3->size;
    local_d0.v2vb.write_.shared_alloc_.direct_ptr = (void *)plVar7[3];
  }
  else {
    local_d0.v2vb.write_.shared_alloc_.alloc = (Alloc *)pAVar3->size;
    local_d0.a2fv.write_.shared_alloc_.alloc = (Alloc *)*plVar7;
  }
  local_d0.a2fv.write_.shared_alloc_.direct_ptr = (void *)plVar7[1];
  *plVar7 = (long)pAVar3;
  plVar7[1] = 0;
  *(undefined1 *)&pAVar3->size = 0;
  local_48 = codes_out;
  begin_code("find_matches_deg",(char *)local_d0.a2fv.write_.shared_alloc_.alloc);
  pLVar2 = &local_d0.v2vb;
  if (local_d0.a2fv.write_.shared_alloc_.alloc != (Alloc *)pLVar2) {
    operator_delete(local_d0.a2fv.write_.shared_alloc_.alloc,
                    (ulong)((long)&(local_d0.v2vb.write_.shared_alloc_.alloc)->size + 1));
  }
  if (local_150 != (Alloc *)local_140) {
    operator_delete(local_150,local_140._0_8_ + 1);
  }
  if ((ulong *)local_140._16_8_ != &local_120) {
    operator_delete((void *)local_140._16_8_,local_120 + 1);
  }
  if (local_110 != (Alloc *)local_100) {
    operator_delete(local_110,local_100._0_8_ + 1);
  }
  pAVar3 = (a2fv->write_).shared_alloc_.alloc;
  if (((ulong)pAVar3 & 1) == 0) {
    uVar9 = pAVar3->size;
  }
  else {
    uVar9 = (ulong)pAVar3 >> 3;
  }
  size_in = (int)(uVar9 >> 2);
  pAVar3 = (av2v->write_).shared_alloc_.alloc;
  if (((ulong)pAVar3 & 1) == 0) {
    uVar9 = pAVar3->size;
  }
  else {
    uVar9 = (ulong)pAVar3 >> 3;
  }
  if (size_in * 3 == (int)(uVar9 >> 3)) {
    local_140._16_8_ = (v2b->super_Graph).a2ab.write_.shared_alloc_.alloc;
    if ((local_140._16_8_ & 7) == 0 && (Alloc *)local_140._16_8_ != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_140._16_8_ = ((Alloc *)local_140._16_8_)->size * 8 + 1;
      }
      else {
        ((Alloc *)local_140._16_8_)->use_count = ((Alloc *)local_140._16_8_)->use_count + 1;
      }
    }
    local_140._24_8_ = (v2b->super_Graph).a2ab.write_.shared_alloc_.direct_ptr;
    local_110 = (v2b->super_Graph).ab2b.write_.shared_alloc_.alloc;
    if (((ulong)local_110 & 7) == 0 && local_110 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_110 = (Alloc *)(local_110->size * 8 + 1);
      }
      else {
        local_110->use_count = local_110->use_count + 1;
      }
    }
    local_108 = (v2b->super_Graph).ab2b.write_.shared_alloc_.direct_ptr;
    local_150 = (v2b->codes).write_.shared_alloc_.alloc;
    if (((ulong)local_150 & 7) == 0 && local_150 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_150 = (Alloc *)(local_150->size * 8 + 1);
      }
      else {
        local_150->use_count = local_150->use_count + 1;
      }
    }
    local_148 = (v2b->codes).write_.shared_alloc_.direct_ptr;
    local_d0.a2fv.write_.shared_alloc_.alloc = (Alloc *)pLVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"");
    Write<int>::Write((Write<int> *)(local_e8 + 8),size_in,(string *)&local_d0);
    if (local_d0.a2fv.write_.shared_alloc_.alloc != (Alloc *)pLVar2) {
      operator_delete(local_d0.a2fv.write_.shared_alloc_.alloc,
                      (ulong)((long)&(local_d0.v2vb.write_.shared_alloc_.alloc)->size + 1));
    }
    local_d0.a2fv.write_.shared_alloc_.alloc = (Alloc *)pLVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"");
    Write<signed_char>::Write((Write<signed_char> *)(local_100 + 0x10),size_in,(string *)&local_d0);
    if (local_d0.a2fv.write_.shared_alloc_.alloc != (Alloc *)pLVar2) {
      operator_delete(local_d0.a2fv.write_.shared_alloc_.alloc,
                      (ulong)((long)&(local_d0.v2vb.write_.shared_alloc_.alloc)->size + 1));
    }
    pWVar5 = local_48;
    local_d0.a2fv.write_.shared_alloc_.alloc = (a2fv->write_).shared_alloc_.alloc;
    if (((ulong)local_d0.a2fv.write_.shared_alloc_.alloc & 7) == 0 &&
        local_d0.a2fv.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_d0.a2fv.write_.shared_alloc_.alloc =
             (Alloc *)((local_d0.a2fv.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_d0.a2fv.write_.shared_alloc_.alloc)->use_count =
             (local_d0.a2fv.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_d0.a2fv.write_.shared_alloc_.direct_ptr = (a2fv->write_).shared_alloc_.direct_ptr;
    local_d0.v2vb.write_.shared_alloc_.alloc = (Alloc *)local_140._16_8_;
    if ((local_140._16_8_ & 7) == 0 && (Alloc *)local_140._16_8_ != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_d0.v2vb.write_.shared_alloc_.alloc = (Alloc *)(*(size_t *)local_140._16_8_ * 8 + 1);
      }
      else {
        *(int *)(local_140._16_8_ + 0x30) = *(int *)(local_140._16_8_ + 0x30) + 1;
      }
    }
    local_d0.v2vb.write_.shared_alloc_.direct_ptr = (void *)local_140._24_8_;
    local_d0.vb2b.write_.shared_alloc_.alloc = local_110;
    if (((ulong)local_110 & 7) == 0 && local_110 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_d0.vb2b.write_.shared_alloc_.alloc = (Alloc *)(local_110->size * 8 + 1);
      }
      else {
        local_110->use_count = local_110->use_count + 1;
      }
    }
    local_d0.vb2b.write_.shared_alloc_.direct_ptr = local_108;
    local_d0.vb_codes.write_.shared_alloc_.alloc = local_150;
    if (((ulong)local_150 & 7) == 0 && local_150 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_d0.vb_codes.write_.shared_alloc_.alloc = (Alloc *)(local_150->size * 8 + 1);
      }
      else {
        local_150->use_count = local_150->use_count + 1;
      }
    }
    local_d0.vb_codes.write_.shared_alloc_.direct_ptr = local_148;
    local_d0.av2v.write_.shared_alloc_.alloc = (av2v->write_).shared_alloc_.alloc;
    if (((ulong)local_d0.av2v.write_.shared_alloc_.alloc & 7) == 0 &&
        local_d0.av2v.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_d0.av2v.write_.shared_alloc_.alloc =
             (Alloc *)((local_d0.av2v.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_d0.av2v.write_.shared_alloc_.alloc)->use_count =
             (local_d0.av2v.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_d0.av2v.write_.shared_alloc_.direct_ptr = (av2v->write_).shared_alloc_.direct_ptr;
    local_d0.bv2v.write_.shared_alloc_.alloc = (local_38->write_).shared_alloc_.alloc;
    if (((ulong)local_d0.bv2v.write_.shared_alloc_.alloc & 7) == 0 &&
        local_d0.bv2v.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_d0.bv2v.write_.shared_alloc_.alloc =
             (Alloc *)((local_d0.bv2v.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_d0.bv2v.write_.shared_alloc_.alloc)->use_count =
             (local_d0.bv2v.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_d0.bv2v.write_.shared_alloc_.direct_ptr = (local_38->write_).shared_alloc_.direct_ptr;
    local_d0.a2b.shared_alloc_.alloc = (Alloc *)local_e8._8_8_;
    if ((local_e8._8_8_ & 7) == 0 && (Alloc *)local_e8._8_8_ != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_d0.a2b.shared_alloc_.alloc = (Alloc *)(*(long *)local_e8._8_8_ * 8 + 1);
      }
      else {
        *(int *)(local_e8._8_8_ + 0x30) = *(int *)(local_e8._8_8_ + 0x30) + 1;
      }
    }
    local_d0.a2b.shared_alloc_.direct_ptr = local_d8;
    local_d0.codes.shared_alloc_.alloc = (Alloc *)local_100._16_8_;
    if ((local_100._16_8_ & 7) == 0 && (Alloc *)local_100._16_8_ != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_d0.codes.shared_alloc_.alloc = (Alloc *)(*(size_t *)local_100._16_8_ * 8 + 1);
      }
      else {
        *(int *)(local_100._16_8_ + 0x30) = *(int *)(local_100._16_8_ + 0x30) + 1;
      }
    }
    local_d0.codes.shared_alloc_.direct_ptr = (void *)local_e8._0_8_;
    local_d0.allow_duplicates = allow_duplicates;
    parallel_for<Omega_h::find_matches_deg<3,long>(Omega_h::Read<int>,Omega_h::Read<long>,Omega_h::Read<long>,Omega_h::Adj,Omega_h::Write<int>*,Omega_h::Write<signed_char>*,bool)::_lambda(int)_1_>
              (size_in,&local_d0);
    pWVar6 = local_40;
    pAVar3 = (local_40->shared_alloc_).alloc;
    if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
      piVar1 = &pAVar3->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar3);
        operator_delete(pAVar3,0x48);
      }
    }
    (pWVar6->shared_alloc_).alloc = (Alloc *)local_e8._8_8_;
    if ((local_e8._8_8_ & 7) == 0 && (Alloc *)local_e8._8_8_ != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        (pWVar6->shared_alloc_).alloc = (Alloc *)(*(long *)local_e8._8_8_ * 8 + 1);
      }
      else {
        *(int *)(local_e8._8_8_ + 0x30) = *(int *)(local_e8._8_8_ + 0x30) + 1;
      }
    }
    (pWVar6->shared_alloc_).direct_ptr = local_d8;
    pAVar3 = (pWVar5->shared_alloc_).alloc;
    if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
      piVar1 = &pAVar3->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar3);
        operator_delete(pAVar3,0x48);
      }
    }
    (pWVar5->shared_alloc_).alloc = (Alloc *)local_100._16_8_;
    if ((local_100._16_8_ & 7) == 0 && (Alloc *)local_100._16_8_ != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        (pWVar5->shared_alloc_).alloc = (Alloc *)(*(size_t *)local_100._16_8_ * 8 + 1);
      }
      else {
        *(int *)(local_100._16_8_ + 0x30) = *(int *)(local_100._16_8_ + 0x30) + 1;
      }
    }
    (pWVar5->shared_alloc_).direct_ptr = (void *)local_e8._0_8_;
    find_matches_deg<3,long>(Omega_h::Read<int>,Omega_h::Read<long>,Omega_h::Read<long>,Omega_h::Adj,Omega_h::Write<int>*,Omega_h::Write<signed_char>*,bool)
    ::{lambda(int)#1}::~Write((_lambda_int__1_ *)&local_d0);
    if ((local_100._16_8_ & 7) == 0 && (Alloc *)local_100._16_8_ != (Alloc *)0x0) {
      piVar1 = (int *)(local_100._16_8_ + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_100._16_8_);
        operator_delete((void *)local_100._16_8_,0x48);
      }
    }
    if ((local_e8._8_8_ & 7) == 0 && (Alloc *)local_e8._8_8_ != (Alloc *)0x0) {
      piVar1 = (int *)(local_e8._8_8_ + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_e8._8_8_);
        operator_delete((void *)local_e8._8_8_,0x48);
      }
    }
    pAVar3 = local_150;
    if (((ulong)local_150 & 7) == 0 && local_150 != (Alloc *)0x0) {
      piVar1 = &local_150->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_150);
        operator_delete(pAVar3,0x48);
      }
    }
    pAVar3 = local_110;
    if (((ulong)local_110 & 7) == 0 && local_110 != (Alloc *)0x0) {
      piVar1 = &local_110->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_110);
        operator_delete(pAVar3,0x48);
      }
    }
    uVar4 = local_140._16_8_;
    if ((local_140._16_8_ & 7) == 0 && (Alloc *)local_140._16_8_ != (Alloc *)0x0) {
      piVar1 = (int *)(local_140._16_8_ + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_140._16_8_);
        operator_delete((void *)uVar4,0x48);
      }
    }
    ScopedTimer::~ScopedTimer(&local_151);
    return;
  }
  fail("assertion %s failed at %s +%d\n","na * deg == av2v.size()",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_adj.cpp"
       ,0x16b);
}

Assistant:

void find_matches_deg(LOs const a2fv, Read<T> const av2v,
    Read<T> const bv2v, Adj const v2b, Write<LO>* a2b_out, Write<I8>* codes_out,
    bool const allow_duplicates) {
  OMEGA_H_TIME_FUNCTION;
  LO const na = a2fv.size();
  OMEGA_H_CHECK(na * deg == av2v.size());
  LOs const v2vb = v2b.a2ab;
  LOs const vb2b = v2b.ab2b;
  Read<I8> const vb_codes = v2b.codes;
  Write<LO> a2b(na);
  Write<I8> codes(na);
  auto f = OMEGA_H_LAMBDA(LO a) {
    auto const fv = a2fv[a];
    auto const a_begin = a * deg;
    auto const vb_begin = v2vb[fv];
    auto const vb_end = v2vb[fv + 1];
    bool found = false;
    for (LO vb = vb_begin; vb < vb_end; ++vb) {
      auto const b = vb2b[vb];
      auto const vb_code = vb_codes[vb];
      auto const which_down = code_which_down(vb_code);
      auto const b_begin = b * deg;
      I8 match_code;
      if (IsMatch<deg>::eval(
              av2v, a_begin, bv2v, b_begin, which_down, &match_code)) {
        OMEGA_H_CHECK(!found);  // there can't be more than one!
        a2b[a] = b;
        codes[a] = match_code;
        found = true;
        if (allow_duplicates) break;
      }
    }
    (void)found;
    OMEGA_H_CHECK(found);  // there can't be less than one!
  };
  parallel_for(na, std::move(f));
  *a2b_out = a2b;
  *codes_out = codes;
}